

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ItemFocusable(ImGuiWindow *window,ImGuiID id)

{
  byte *pbVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  pIVar4 = GImGui;
  if ((id == 0) || ((window->DC).LastItemId != id)) {
    __assert_fail("id != 0 && id == window->DC.LastItemId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0xcc1,"void ImGui::ItemFocusable(ImGuiWindow *, ImGuiID)");
  }
  uVar2 = GImGui->CurrentItemFlags;
  iVar5 = (window->DC).FocusCounterRegular + 1;
  (window->DC).FocusCounterRegular = iVar5;
  if ((uVar2 & 5) == 0) {
    iVar6 = (window->DC).FocusCounterTabStop + 1;
    (window->DC).FocusCounterTabStop = iVar6;
    if (pIVar4->NavId == id) {
      pIVar4->NavIdTabCounter = iVar6;
    }
  }
  if ((((pIVar4->ActiveId == id) && (pIVar4->TabFocusPressed == true)) &&
      ((pIVar4->ActiveIdUsingKeyInputMask & 1) == 0)) &&
     (pIVar4->TabFocusRequestNextWindow == (ImGuiWindow *)0x0)) {
    pIVar4->TabFocusRequestNextWindow = window;
    iVar6 = 1;
    if ((pIVar4->IO).KeyShift != false) {
      iVar6 = -(uint)((uVar2 & 5) == 0);
    }
    pIVar4->TabFocusRequestNextCounterTabStop = iVar6 + (window->DC).FocusCounterTabStop;
  }
  pIVar3 = GImGui;
  if (pIVar4->TabFocusRequestCurrWindow == window) {
    if (iVar5 == pIVar4->TabFocusRequestCurrCounterRegular) {
      pbVar1 = (byte *)((long)&(window->DC).LastItemStatusFlags + 1);
      *pbVar1 = *pbVar1 | 1;
      return;
    }
    if (((uVar2 & 5) == 0) &&
       ((window->DC).FocusCounterTabStop == pIVar4->TabFocusRequestCurrCounterTabStop)) {
      pIVar4->NavJustTabbedId = id;
      pbVar1 = (byte *)((long)&(window->DC).LastItemStatusFlags + 1);
      *pbVar1 = *pbVar1 | 2;
      return;
    }
    if (pIVar4->ActiveId == id) {
      bVar7 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar7;
      if (bVar7) {
        pIVar3->ActiveIdTimer = 0.0;
        pIVar3->ActiveIdHasBeenPressedBefore = false;
        pIVar3->ActiveIdHasBeenEditedBefore = false;
        pIVar3->ActiveIdMouseButton = -1;
      }
      pIVar3->ActiveId = 0;
      pIVar3->ActiveIdAllowOverlap = false;
      pIVar3->ActiveIdNoClearOnFocusLoss = false;
      pIVar3->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar3->ActiveIdHasBeenEditedThisFrame = false;
      pIVar3->ActiveIdUsingMouseWheel = false;
      pIVar3->ActiveIdUsingNavDirMask = 0;
      pIVar3->ActiveIdUsingNavInputMask = 0;
      pIVar3->ActiveIdUsingKeyInputMask = 0;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ItemFocusable(ImGuiWindow* window, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0 && id == window->DC.LastItemId);

    // Increment counters
    // FIXME: ImGuiItemFlags_Disabled should disable more.
    const bool is_tab_stop = (g.CurrentItemFlags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
    window->DC.FocusCounterRegular++;
    if (is_tab_stop)
    {
        window->DC.FocusCounterTabStop++;
        if (g.NavId == id)
            g.NavIdTabCounter = window->DC.FocusCounterTabStop;
    }

    // Process TAB/Shift-TAB to tab *OUT* of the currently focused item.
    // (Note that we can always TAB out of a widget that doesn't allow tabbing in)
    if (g.ActiveId == id && g.TabFocusPressed && !IsActiveIdUsingKey(ImGuiKey_Tab) && g.TabFocusRequestNextWindow == NULL)
    {
        g.TabFocusRequestNextWindow = window;
        g.TabFocusRequestNextCounterTabStop = window->DC.FocusCounterTabStop + (g.IO.KeyShift ? (is_tab_stop ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.
    }

    // Handle focus requests
    if (g.TabFocusRequestCurrWindow == window)
    {
        if (window->DC.FocusCounterRegular == g.TabFocusRequestCurrCounterRegular)
        {
            window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_FocusedByCode;
            return;
        }
        if (is_tab_stop && window->DC.FocusCounterTabStop == g.TabFocusRequestCurrCounterTabStop)
        {
            g.NavJustTabbedId = id;
            window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_FocusedByTabbing;
            return;
        }

        // If another item is about to be focused, we clear our own active id
        if (g.ActiveId == id)
            ClearActiveID();
    }
}